

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

void __thiscall SimpleString::replace(SimpleString *this,char *to,char *with)

{
  int iVar1;
  size_t sVar2;
  TestMemoryAllocator *pTVar3;
  undefined4 extraout_var;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char cVar8;
  SimpleString *this_00;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  SimpleString local_40;
  
  SimpleString(&local_40,to);
  sVar2 = count(this,&local_40);
  deallocateInternalBuffer(&local_40);
  if (sVar2 != 0) {
    uVar7 = 0;
    do {
      uVar14 = uVar7;
      uVar7 = uVar14 + 1;
    } while (this->buffer_[uVar14] != '\0');
    lVar12 = -uVar7;
    lVar6 = -1;
    do {
      lVar12 = lVar12 + sVar2;
      lVar5 = lVar6 + 1;
      lVar6 = lVar6 + 1;
    } while (to[lVar5] != '\0');
    uVar13 = -lVar12;
    lVar12 = -1;
    do {
      uVar13 = uVar13 + sVar2;
      lVar5 = lVar12 + 1;
      lVar12 = lVar12 + 1;
    } while (with[lVar5] != '\0');
    if (uVar13 < 2) {
      this_00 = this;
      deallocateInternalBuffer(this);
      this->bufferSize_ = 1;
      pcVar4 = getEmptyString(this_00);
    }
    else {
      pTVar3 = stringAllocator_;
      if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
        pTVar3 = defaultNewArrayAllocator();
      }
      iVar1 = (*pTVar3->_vptr_TestMemoryAllocator[2])
                        (pTVar3,uVar13,
                         "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O3/_deps/cpputest-src/src/CppUTest/SimpleString.cpp"
                         ,0x197);
      pcVar4 = (char *)CONCAT44(extraout_var,iVar1);
      if (uVar7 != 1) {
        lVar5 = 0;
        uVar7 = 0;
        do {
          if (lVar6 != 0) {
            lVar9 = 0;
            do {
              cVar8 = (this->buffer_ + uVar7)[lVar9];
              if ((cVar8 == '\0') || (cVar8 != to[lVar9])) {
                if (cVar8 != to[lVar9]) {
                  pcVar4[lVar5] = this->buffer_[uVar7];
                  lVar9 = 1;
                  lVar10 = 1;
                  goto LAB_0010c7e4;
                }
                break;
              }
              lVar9 = lVar9 + 1;
            } while (lVar6 != lVar9);
          }
          lVar9 = lVar6;
          lVar10 = lVar12;
          if (lVar12 != -1 && pcVar4 != (char *)0x0) {
            cVar8 = *with;
            pcVar4[lVar5] = cVar8;
            if (lVar12 == 0) {
              lVar10 = 0;
            }
            else {
              lVar11 = 0;
              do {
                if (cVar8 == '\0') break;
                cVar8 = with[lVar11 + 1];
                pcVar4[lVar11 + lVar5 + 1] = cVar8;
                lVar11 = lVar11 + 1;
              } while (lVar12 != lVar11);
            }
          }
LAB_0010c7e4:
          lVar5 = lVar5 + lVar10;
          uVar7 = uVar7 + lVar9;
        } while (uVar7 < uVar14);
      }
      pcVar4[uVar13 - 1] = '\0';
      deallocateInternalBuffer(this);
      this->bufferSize_ = uVar13;
    }
    this->buffer_ = pcVar4;
  }
  return;
}

Assistant:

void SimpleString::replace(const char* to, const char* with)
{
    size_t c = count(to);
    if (c == 0) {
        return;
    }
    size_t len = size();
    size_t tolen = StrLen(to);
    size_t withlen = StrLen(with);

    size_t newsize = len + (withlen * c) - (tolen * c) + 1;

    if (newsize > 1) {
        char* newbuf = allocStringBuffer(newsize, __FILE__, __LINE__);
        for (size_t i = 0, j = 0; i < len;) {
            if (StrNCmp(&getBuffer()[i], to, tolen) == 0) {
                StrNCpy(&newbuf[j], with, withlen + 1);
                j += withlen;
                i += tolen;
            }
            else {
                newbuf[j] = getBuffer()[i];
                j++;
                i++;
            }
        }
        newbuf[newsize - 1] = '\0';
        setInternalBufferTo(newbuf, newsize);
    }
    else
        setInternalBufferAsEmptyString();
}